

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  long *plVar4;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  long *plVar6;
  long lVar7;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test GL_MAX_COLOR_TEXTURE_SAMPLES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aed68;
    pTVar3[1].m_testCtx = (TestContext *)0x10000910e;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test GL_MAX_DEPTH_TEXTURE_SAMPLES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aed68;
    pTVar3[1].m_testCtx = (TestContext *)0x10000910f;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test GL_MAX_INTEGER_SAMPLES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aed68;
    pTVar3[1].m_testCtx = (TestContext *)0x100009110;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test TEXTURE_BINDING_2D_MULTISAMPLE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aedb8;
    pTVar3[1].m_testCtx = (TestContext *)0x910400009100;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aedb8;
    pTVar3[1].m_testCtx = (TestContext *)0x910500009102;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test TEXTURE_BINDING_CUBE_MAP_ARRAY");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aedb8;
    pTVar3[1].m_testCtx = (TestContext *)0x900a00009009;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test TEXTURE_BINDING_BUFFER");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aedb8;
    pTVar3[1].m_testCtx = (TestContext *)0x8c2c00008c2a;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_ATTRIB_RELATIVE_OFFSET");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x7ff000082d9;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_ATTRIB_BINDINGS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x10000082da;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_VERTEX_ATTRIB_STRIDE"
              );
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x800000082e5;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_SAMPLE_MASK_WORDS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x100008e59;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee58;
    pTVar3[1].m_testCtx = (TestContext *)0x100000090df;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test DRAW_INDIRECT_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeea8;
    pTVar3[1].m_testCtx = (TestContext *)0x8f3f00008f43;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test ATOMIC_COUNTER_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeea8;
    pTVar3[1].m_testCtx = (TestContext *)0x92c0000092c1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test SHADER_STORAGE_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeea8;
    pTVar3[1].m_testCtx = (TestContext *)0x90d2000090d3;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test DISPATCH_INDIRECT_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeea8;
    pTVar3[1].m_testCtx = (TestContext *)0x90ee000090ef;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_FRAMEBUFFER_WIDTH");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeef8;
    pTVar3[1].m_testCtx = (TestContext *)0xd3300009315;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x800;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_FRAMEBUFFER_HEIGHT");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeef8;
    pTVar3[1].m_testCtx = (TestContext *)0xd3300009316;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x800;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_FRAMEBUFFER_SAMPLES")
    ;
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aeef8;
    pTVar3[1].m_testCtx = (TestContext *)0x8d5700009318;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 4;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test PROGRAM_PIPELINE_BINDING"
              );
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aef48;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92cc;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d2;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90ca;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90d6;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008b4a;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d0;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d6;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90ce;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90da;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008b49;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_WORK_GROUP_INVOCATIONS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x80000090eb;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_UNIFORM_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0xc000091bb;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_TEXTURE_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x10000091bc;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_SHARED_MEMORY_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400000008262;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008263;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x100008264;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x800008265;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000091bd;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMPUTE_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000090db;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_UNIFORM_LOCATIONS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000000826e;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_ATOMIC_COUNTER_BUFFER_BINDINGS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000092dc;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_ATOMIC_COUNTER_BUFFER_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x20000092d8;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000092d1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x8000092d7;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400008f38;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000090cf;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_SHADER_STORAGE_BUFFER_BINDINGS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000090dd;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_SHADER_STORAGE_BLOCK_SIZE");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x8000000000090de;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000090dc;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_SHADER_OUTPUT_RESOURCES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400008f39;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_UNIFORM_BUFFER_BINDINGS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aef98;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_UNIFORM_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aefe8;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af038;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af088;
    *(undefined4 *)&pTVar3[1].m_testCtx = 0x8266;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x13;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_VERTEX_UNIFORM_VECTORS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af0d8;
    pTVar3[1].m_testCtx = (TestContext *)0x8b4a00008dfb;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_FRAGMENT_UNIFORM_VECTORS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af0d8;
    pTVar3[1].m_testCtx = (TestContext *)0x8b4900008dfd;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MIN_PROGRAM_TEXTURE_GATHER_OFFSET");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af128;
    *(undefined1 *)&pTVar3[1].m_testCtx = 0;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_PROGRAM_TEXTURE_GATHER_OFFSET");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af128;
    *(undefined1 *)&pTVar3[1].m_testCtx = 1;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_FRAMEBUFFER_LAYERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x10000009317;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400008e5d;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_TEXTURE_BUFFER_SIZE")
    ;
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000000008c2b;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee58;
    pTVar3[1].m_testCtx = (TestContext *)0x1000000919f;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_TESS_GEN_LEVEL");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000008e7e;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_PATCH_VERTICES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x2000008e7d;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_PATCH_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x7800008e84;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008e7f;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000008e81;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000008e83;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x80000008e85;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_INPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400000886c;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_UNIFORM_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0xc00008e89;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92cd;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d3;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90d8;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008e80;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000008e82;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000008e86;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_INPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400000886d;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0xc00008e8a;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92ce;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d4;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90d9;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008ddf;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_UNIFORM_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0xc00008a2c;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_INPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000009123;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_OUTPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x4000009124;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_OUTPUT_VERTICES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x10000008de0;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x40000008de1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_TEXTURE_IMAGE_UNITS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x1000008c29;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_SHADER_INVOCATIONS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x2000008e5a;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92cf;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_ATOMIC_COUNTERS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x92d5;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_SHADER_STORAGE_BLOCKS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90d7;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_CONTROL_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90cb;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90cc;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_GEOMETRY_IMAGE_UNIFORMS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x90cd;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test DEBUG_LOGGED_MESSAGES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x9145;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x8243;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test DEBUG_GROUP_STACK_DEPTH")
    ;
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x826d;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_DEBUG_MESSAGE_LENGTH"
              );
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x100009143;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_DEBUG_LOGGED_MESSAGES");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x100009144;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_DEBUG_GROUP_STACK_DEPTH");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x400000826c;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test MAX_LABEL_LENGTH");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x100000082e8;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,"Test TEXTURE_BUFFER_BINDING");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aee08;
    pTVar3[1].m_testCtx = (TestContext *)0x8c2a;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af088;
    *(undefined4 *)&pTVar3[1].m_testCtx = 0x8e1e;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af088;
    *(undefined4 *)&pTVar3[1].m_testCtx = 0x8e1f;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)
             ((long)deqp::gles3::Functional::IntegerStateQueryTests::init::queryTypes + lVar7);
    pTVar3 = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,(char *)local_70,
               "Test MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS");
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021af088;
    *(undefined4 *)&pTVar3[1].m_testCtx = 0x8a32;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = uVar1;
    *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0x23;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    puVar5 = &local_40;
    if (local_50 != puVar5) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      puVar5 = extraout_RAX;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  return (int)puVar5;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	// Verifiers
	const QueryType verifiers[]	= { QUERY_BOOLEAN, QUERY_INTEGER, QUERY_INTEGER64, QUERY_FLOAT };

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];									\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_color_texture_samples_" + verifierSuffix).c_str(),				"Test GL_MAX_COLOR_TEXTURE_SAMPLES",			GL_MAX_COLOR_TEXTURE_SAMPLES,		1,	verifier))
	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_depth_texture_samples_" + verifierSuffix).c_str(),				"Test GL_MAX_DEPTH_TEXTURE_SAMPLES",			GL_MAX_DEPTH_TEXTURE_SAMPLES,		1,	verifier))
	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_integer_samples_" + verifierSuffix).c_str(),						"Test GL_MAX_INTEGER_SAMPLES",					GL_MAX_INTEGER_SAMPLES,				1,	verifier))

	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_2d_multisample_" + verifierSuffix).c_str(),			"Test TEXTURE_BINDING_2D_MULTISAMPLE",			GL_TEXTURE_2D_MULTISAMPLE,			GL_TEXTURE_BINDING_2D_MULTISAMPLE,			verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_2d_multisample_array_" + verifierSuffix).c_str(),		"Test TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY,	verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_cube_map_array_" + verifierSuffix).c_str(),			"Test TEXTURE_BINDING_CUBE_MAP_ARRAY",			GL_TEXTURE_CUBE_MAP_ARRAY,			GL_TEXTURE_BINDING_CUBE_MAP_ARRAY,			verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_buffer_" + verifierSuffix).c_str(),					"Test TEXTURE_BINDING_BUFFER",					GL_TEXTURE_BUFFER,					GL_TEXTURE_BINDING_BUFFER,					verifier))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_relative_offset_" + verifierSuffix).c_str(),		"Test MAX_VERTEX_ATTRIB_RELATIVE_OFFSET",		GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET,	2047,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_bindings_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_ATTRIB_BINDINGS",				GL_MAX_VERTEX_ATTRIB_BINDINGS,			16,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_stride_" + verifierSuffix).c_str(),					"Test MAX_VERTEX_ATTRIB_STRIDE",				GL_MAX_VERTEX_ATTRIB_STRIDE,			2048,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_sample_mask_words_" + verifierSuffix).c_str(),					"Test MAX_SAMPLE_MASK_WORDS",					GL_MAX_SAMPLE_MASK_WORDS,				1,		verifier))

	FOR_EACH_VERIFIER(new AlignmentCase(m_context,		(std::string() + "shader_storage_buffer_offset_alignment_" + verifierSuffix).c_str(),	"Test SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT",	GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT,	256,	verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "draw_indirect_buffer_binding_" + verifierSuffix).c_str(),				"Test DRAW_INDIRECT_BUFFER_BINDING",			GL_DRAW_INDIRECT_BUFFER_BINDING,		GL_DRAW_INDIRECT_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "atomic_counter_buffer_binding_" + verifierSuffix).c_str(),			"Test ATOMIC_COUNTER_BUFFER_BINDING",			GL_ATOMIC_COUNTER_BUFFER_BINDING,		GL_ATOMIC_COUNTER_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "shader_storage_buffer_binding_" + verifierSuffix).c_str(),			"Test SHADER_STORAGE_BUFFER_BINDING",			GL_SHADER_STORAGE_BUFFER_BINDING,		GL_SHADER_STORAGE_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "dispatch_indirect_buffer_binding_" + verifierSuffix).c_str(),			"Test DISPATCH_INDIRECT_BUFFER_BINDING",		GL_DISPATCH_INDIRECT_BUFFER_BINDING,	GL_DISPATCH_INDIRECT_BUFFER,	verifier))

	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_width_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_WIDTH",					GL_MAX_FRAMEBUFFER_WIDTH,				2048,	GL_MAX_TEXTURE_SIZE,	verifier))
	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_height_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_HEIGHT",					GL_MAX_FRAMEBUFFER_HEIGHT,				2048,	GL_MAX_TEXTURE_SIZE,	verifier))
	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_samples_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_SAMPLES",					GL_MAX_FRAMEBUFFER_SAMPLES,				4,		GL_MAX_SAMPLES,			verifier))

	FOR_EACH_VERIFIER(new ProgramPipelineBindingCase(m_context,	(std::string() + "program_pipeline_binding_" + verifierSuffix).c_str(),			"Test PROGRAM_PIPELINE_BINDING",	verifier))

	// vertex
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_VERTEX_ATOMIC_COUNTER_BUFFERS",		GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_ATOMIC_COUNTERS",				GL_MAX_VERTEX_ATOMIC_COUNTERS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_IMAGE_UNIFORMS",				GL_MAX_VERTEX_IMAGE_UNIFORMS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_shader_storage_blocks_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_SHADER_STORAGE_BLOCKS",		GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_UNIFORM_COMPONENTS",			GL_MAX_VERTEX_UNIFORM_COMPONENTS,		1024,	verifier))

	// fragment
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS",		GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_FRAGMENT_ATOMIC_COUNTERS",			GL_MAX_FRAGMENT_ATOMIC_COUNTERS,		0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_FRAGMENT_IMAGE_UNIFORMS",				GL_MAX_FRAGMENT_IMAGE_UNIFORMS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_FRAGMENT_SHADER_STORAGE_BLOCKS",		GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_FRAGMENT_UNIFORM_COMPONENTS",			GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,		1024,	verifier))

	// compute
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_work_group_invocations_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_INVOCATIONS",		GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS,		128,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_UNIFORM_BLOCKS",				GL_MAX_COMPUTE_UNIFORM_BLOCKS,				12,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_TEXTURE_IMAGE_UNITS",			GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS,			16,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_shared_memory_size_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_SHARED_MEMORY_SIZE",			GL_MAX_COMPUTE_SHARED_MEMORY_SIZE,			16384,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_UNIFORM_COMPONENTS",			GL_MAX_COMPUTE_UNIFORM_COMPONENTS,			1024,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS",		GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_ATOMIC_COUNTERS",				GL_MAX_COMPUTE_ATOMIC_COUNTERS,				8,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_IMAGE_UNIFORMS",				GL_MAX_COMPUTE_IMAGE_UNIFORMS,				4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_SHADER_STORAGE_BLOCKS",		GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS,		4,		verifier))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_uniform_locations_" + verifierSuffix).c_str(),					"Test MAX_UNIFORM_LOCATIONS",					GL_MAX_UNIFORM_LOCATIONS,					1024,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_atomic_counter_buffer_bindings_" + verifierSuffix).c_str(),		"Test MAX_ATOMIC_COUNTER_BUFFER_BINDINGS",		GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_atomic_counter_buffer_size_" + verifierSuffix).c_str(),			"Test MAX_ATOMIC_COUNTER_BUFFER_SIZE",			GL_MAX_ATOMIC_COUNTER_BUFFER_SIZE,			32,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_ATOMIC_COUNTER_BUFFERS",		GL_MAX_COMBINED_ATOMIC_COUNTER_BUFFERS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_ATOMIC_COUNTERS",			GL_MAX_COMBINED_ATOMIC_COUNTERS,			8,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_image_units_" + verifierSuffix).c_str(),							"Test MAX_IMAGE_UNITS",							GL_MAX_IMAGE_UNITS,							4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_IMAGE_UNIFORMS",				GL_MAX_COMBINED_IMAGE_UNIFORMS,				4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_shader_storage_buffer_bindings_" + verifierSuffix).c_str(),		"Test MAX_SHADER_STORAGE_BUFFER_BINDINGS",		GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,		4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_shader_storage_block_size_" + verifierSuffix).c_str(),			"Test MAX_SHADER_STORAGE_BLOCK_SIZE",			GL_MAX_SHADER_STORAGE_BLOCK_SIZE,			1<<27,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_SHADER_STORAGE_BLOCKS",		GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS,		4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_shader_output_resources_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_SHADER_OUTPUT_RESOURCES",	GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES,	4,		verifier))

	FOR_EACH_VERIFIER(new MaxUniformBufferBindingsCase	(m_context,	(std::string() + "max_uniform_buffer_bindings_" + verifierSuffix).c_str(),				"Test MAX_UNIFORM_BUFFER_BINDINGS",				verifier))
	FOR_EACH_VERIFIER(new MaxCombinedUniformBlocksCase	(m_context,	(std::string() + "max_combined_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_UNIFORM_BLOCKS",				verifier))
	FOR_EACH_VERIFIER(new MaxCombinedTexImageUnitsCase	(m_context,	(std::string() + "max_combined_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",		verifier))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_compute_uniform_components_" + verifierSuffix).c_str(),	"Test MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS, verifier))

	FOR_EACH_VERIFIER(new LegacyVectorLimitCase(m_context,	(std::string() + "max_vertex_uniform_vectors_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_UNIFORM_VECTORS",				GL_MAX_VERTEX_UNIFORM_VECTORS,			GL_MAX_VERTEX_UNIFORM_COMPONENTS,	verifier))
	FOR_EACH_VERIFIER(new LegacyVectorLimitCase(m_context,	(std::string() + "max_fragment_uniform_vectors_" + verifierSuffix).c_str(),			"Test MAX_FRAGMENT_UNIFORM_VECTORS",			GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,	verifier))

	FOR_EACH_VERIFIER(new TextureGatherLimitCase(m_context,	(std::string() + "min_program_texture_gather_offset_" + verifierSuffix).c_str(),	"Test MIN_PROGRAM_TEXTURE_GATHER_OFFSET",		false,		verifier))
	FOR_EACH_VERIFIER(new TextureGatherLimitCase(m_context,	(std::string() + "max_program_texture_gather_offset_" + verifierSuffix).c_str(),	"Test MAX_PROGRAM_TEXTURE_GATHER_OFFSET",		true,		verifier))

	// GL ES 3.2 tests
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "max_framebuffer_layers_" + verifierSuffix).c_str(),						"Test MAX_FRAMEBUFFER_LAYERS",						GL_MAX_FRAMEBUFFER_LAYERS,						256,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "fragment_interpolation_offset_bits_" + verifierSuffix).c_str(),			"Test FRAGMENT_INTERPOLATION_OFFSET_BITS",			GL_FRAGMENT_INTERPOLATION_OFFSET_BITS,			4,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "max_texture_buffer_size_" + verifierSuffix).c_str(),						"Test MAX_TEXTURE_BUFFER_SIZE",						GL_MAX_TEXTURE_BUFFER_SIZE,						65536,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new AlignmentCase		(m_context,	(std::string() + "texture_buffer_offset_alignment_" + verifierSuffix).c_str(),				"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",				GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,				256,	verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_gen_level_" + verifierSuffix).c_str(),							"Test MAX_TESS_GEN_LEVEL",							GL_MAX_TESS_GEN_LEVEL,							64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_patch_vertices_" + verifierSuffix).c_str(),							"Test MAX_PATCH_VERTICES",							GL_MAX_PATCH_VERTICES,							32,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_patch_components_" + verifierSuffix).c_str(),					"Test MAX_TESS_PATCH_COMPONENTS",					GL_MAX_TESS_PATCH_COMPONENTS,					120,	verifier,	glu::ApiType::es(3, 2)))

	// tess control
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",			GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",		GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_output_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",			GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_total_output_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",	GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_input_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",			GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",				GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0,		verifier,	glu::ApiType::es(3, 2)))

	// tess evaluation
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_uniform_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",		GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_texture_image_units_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",		GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_output_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",		GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_input_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",		GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_uniform_blocks_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",			GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_atomic_counter_buffers_" + verifierSuffix).c_str(),	"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",	GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_atomic_counters_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",			GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_shader_storage_blocks_" + verifierSuffix).c_str(),	"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",	GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0,		verifier,	glu::ApiType::es(3, 2)))

	// geometry
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_uniform_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_UNIFORM_COMPONENTS",				GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_uniform_blocks_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_UNIFORM_BLOCKS",					GL_MAX_GEOMETRY_UNIFORM_BLOCKS,					12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_input_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_INPUT_COMPONENTS",				GL_MAX_GEOMETRY_INPUT_COMPONENTS,				64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_output_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_OUTPUT_COMPONENTS",				GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_output_vertices_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_OUTPUT_VERTICES",				GL_MAX_GEOMETRY_OUTPUT_VERTICES,				256,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_total_output_components_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_texture_image_units_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_TEXTURE_IMAGE_UNITS",			GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_shader_invocations_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_SHADER_INVOCATIONS",				GL_MAX_GEOMETRY_SHADER_INVOCATIONS,				32,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_atomic_counter_buffers_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS",			GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_atomic_counters_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_ATOMIC_COUNTERS",				GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_shader_storage_blocks_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_SHADER_STORAGE_BLOCKS",			GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,			0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",				GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_image_uniforms_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",			GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_image_uniforms_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_IMAGE_UNIFORMS",					GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_logged_messages_" + verifierSuffix).c_str(),						"Test DEBUG_LOGGED_MESSAGES",						GL_DEBUG_LOGGED_MESSAGES,						0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_next_logged_message_length_" + verifierSuffix).c_str(),				"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",			GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_group_stack_depth_" + verifierSuffix).c_str(),						"Test DEBUG_GROUP_STACK_DEPTH",						GL_DEBUG_GROUP_STACK_DEPTH,						0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_message_length_" + verifierSuffix).c_str(),						"Test MAX_DEBUG_MESSAGE_LENGTH",					GL_MAX_DEBUG_MESSAGE_LENGTH,					1,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_logged_messages_" + verifierSuffix).c_str(),					"Test MAX_DEBUG_LOGGED_MESSAGES",					GL_MAX_DEBUG_LOGGED_MESSAGES,					1,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_group_stack_depth_" + verifierSuffix).c_str(),					"Test MAX_DEBUG_GROUP_STACK_DEPTH",					GL_MAX_DEBUG_GROUP_STACK_DEPTH,					64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_label_length_" + verifierSuffix).c_str(),								"Test MAX_LABEL_LENGTH",							GL_MAX_LABEL_LENGTH,							256,	verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "texture_buffer_binding_" + verifierSuffix).c_str(),						"Test TEXTURE_BUFFER_BINDING",						GL_TEXTURE_BUFFER_BINDING,						0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_tess_control_uniform_components_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_tess_evaluation_uniform_components_" + verifierSuffix).c_str(),	"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS, verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_geometry_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS",		GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS,		verifier,	glu::ApiType::es(3, 2)))

#undef FOR_EACH_VERIFIER
}